

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O2

void __thiscall CodeGen::generateRecordTraits(CodeGen *this,NodePtr *n)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  size_t i;
  ulong uVar4;
  string fn;
  string local_70;
  string local_50;
  ulong uVar2;
  
  iVar1 = (*n->px->_vptr_Node[4])();
  uVar2 = CONCAT44(extraout_var,iVar1);
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = (*n->px->_vptr_Node[5])(n->px,uVar4 & 0xffffffff);
    generateTraits(this,(NodePtr *)CONCAT44(extraout_var_00,iVar1));
  }
  iVar1 = (*n->px->_vptr_Node[3])();
  std::__cxx11::string::string
            ((string *)&local_50,(string *)(CONCAT44(extraout_var_01,iVar1) + 0x20));
  fullname(&local_70,this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  poVar3 = std::operator<<(this->os_,"template<> struct codec_traits<");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"> {\n");
  poVar3 = std::operator<<(poVar3,"    static void encode(Encoder& e, const ");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,"& v) {\n");
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<(this->os_,"        avro::encode(e, v.");
    iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar1));
    std::operator<<(poVar3,");\n");
  }
  poVar3 = std::operator<<(this->os_,"    }\n");
  poVar3 = std::operator<<(poVar3,"    static void decode(Decoder& d, ");
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,"& v) {\n");
  std::operator<<(this->os_,"        if (avro::ResolvingDecoder *rd =\n");
  std::operator<<(this->os_,"            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n");
  std::operator<<(this->os_,"            const std::vector<size_t> fo = rd->fieldOrder();\n");
  std::operator<<(this->os_,
                  "            for (std::vector<size_t>::const_iterator it = fo.begin();\n");
  std::operator<<(this->os_,"                it != fo.end(); ++it) {\n");
  std::operator<<(this->os_,"                switch (*it) {\n");
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<(this->os_,"                case ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,":\n");
    poVar3 = std::operator<<(this->os_,"                    avro::decode(d, v.");
    iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar1));
    std::operator<<(poVar3,");\n");
    std::operator<<(this->os_,"                    break;\n");
  }
  std::operator<<(this->os_,"                default:\n");
  std::operator<<(this->os_,"                    break;\n");
  std::operator<<(this->os_,"                }\n");
  std::operator<<(this->os_,"            }\n");
  std::operator<<(this->os_,"        } else {\n");
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = std::operator<<(this->os_,"            avro::decode(d, v.");
    iVar1 = (*n->px->_vptr_Node[8])(n->px,uVar4 & 0xffffffff);
    poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_04,iVar1));
    std::operator<<(poVar3,");\n");
  }
  std::operator<<(this->os_,"        }\n");
  poVar3 = std::operator<<(this->os_,"    }\n");
  std::operator<<(poVar3,"};\n\n");
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void CodeGen::generateRecordTraits(const NodePtr& n)
{
    size_t c = n->leaves();
    for (size_t i = 0; i < c; ++i) {
        generateTraits(n->leafAt(i));
    }

    string fn = fullname(decorate(n->name()));
    os_ << "template<> struct codec_traits<" << fn << "> {\n"
        << "    static void encode(Encoder& e, const " << fn << "& v) {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "        avro::encode(e, v." << n->nameAt(i) << ");\n";
    }

    os_ << "    }\n"
        << "    static void decode(Decoder& d, " << fn << "& v) {\n";
    os_ << "        if (avro::ResolvingDecoder *rd =\n";
    os_ << "            dynamic_cast<avro::ResolvingDecoder *>(&d)) {\n";
    os_ << "            const std::vector<size_t> fo = rd->fieldOrder();\n";
    os_ << "            for (std::vector<size_t>::const_iterator it = fo.begin();\n";
    os_ << "                it != fo.end(); ++it) {\n";
    os_ << "                switch (*it) {\n";
    for (size_t i = 0; i < c; ++i) {
        os_ << "                case " << i << ":\n";
        os_ << "                    avro::decode(d, v." << n->nameAt(i) << ");\n";
        os_ << "                    break;\n";
    }
    os_ << "                default:\n";
    os_ << "                    break;\n";
    os_ << "                }\n";
    os_ << "            }\n";
    os_ << "        } else {\n";

    for (size_t i = 0; i < c; ++i) {
        os_ << "            avro::decode(d, v." << n->nameAt(i) << ");\n";
    }
    os_ << "        }\n";

    os_ << "    }\n"
        << "};\n\n";
}